

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ivyFraig.c
# Opt level: O0

int Ivy_FraigCheckOutputSims(Ivy_FraigMan_t *p)

{
  int iVar1;
  Ivy_Obj_t *pIVar2;
  Ivy_Obj_t *pObj_00;
  int local_24;
  int i;
  Ivy_Obj_t *pObj;
  Ivy_FraigMan_t *p_local;
  
  local_24 = 0;
  while( true ) {
    iVar1 = Vec_PtrSize(p->pManAig->vPos);
    if (iVar1 <= local_24) {
      return 0;
    }
    pIVar2 = (Ivy_Obj_t *)Vec_PtrEntry(p->pManAig->vPos,local_24);
    pObj_00 = Ivy_ObjFanin0(pIVar2);
    iVar1 = Ivy_NodeHasZeroSim(p,pObj_00);
    if (iVar1 == 0) break;
    local_24 = local_24 + 1;
  }
  pIVar2 = Ivy_ObjFanin0(pIVar2);
  Ivy_FraigCheckOutputSimsSavePattern(p,pIVar2);
  return 1;
}

Assistant:

int Ivy_FraigCheckOutputSims( Ivy_FraigMan_t * p )
{
    Ivy_Obj_t * pObj;
    int i;
    // make sure the reference simulation pattern does not detect the bug
//    pObj = Ivy_ManPo( p->pManAig, 0 );
    Ivy_ManForEachPo( p->pManAig, pObj, i )
    {
        //assert( Ivy_ObjFanin0(pObj)->fPhase == (unsigned)Ivy_ObjFaninC0(pObj) ); // Ivy_ObjFaninPhase(Ivy_ObjChild0(pObj)) == 0
        // complement simulation info
//        if ( Ivy_ObjFanin0(pObj)->fPhase ^ Ivy_ObjFaninC0(pObj) ) // Ivy_ObjFaninPhase(Ivy_ObjChild0(pObj))
//            Ivy_NodeComplementSim( p, Ivy_ObjFanin0(pObj) );
        // check 
        if ( !Ivy_NodeHasZeroSim( p, Ivy_ObjFanin0(pObj) ) )
        {
            // create the counter-example from this pattern
            Ivy_FraigCheckOutputSimsSavePattern( p, Ivy_ObjFanin0(pObj) );
            return 1;
        }
        // complement simulation info
//        if ( Ivy_ObjFanin0(pObj)->fPhase ^ Ivy_ObjFaninC0(pObj) )
//            Ivy_NodeComplementSim( p, Ivy_ObjFanin0(pObj) );
    }
    return 0;
}